

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustTokenMetadataTest_TooManyRequests_Test::TestBody
          (TrustTokenMetadataTest_TooManyRequests_Test *this)

{
  uint8_t *request;
  bool bVar1;
  uint32_t public_metadata;
  TRUST_TOKEN_METHOD *pTVar2;
  pointer ptVar3;
  char *pcVar4;
  pointer ctx;
  char *message;
  stack_st_TRUST_TOKEN *__p;
  pointer sk;
  char *in_R9;
  AssertHelper local_1f8;
  Message local_1f0;
  unsigned_long local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  size_t key_index;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> free_msg;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  size_t tokens_issued;
  UniquePtr<uint8_t> free_issue_msg;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  size_t resp_len;
  size_t msg_len;
  uint8_t *issue_resp;
  uint8_t *issue_msg;
  Message local_40;
  uint local_38;
  undefined1 local_28 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  TrustTokenMetadataTest_TooManyRequests_Test *this_local;
  
  gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)this;
  pTVar2 = TrustTokenProtocolTestBase::method((TrustTokenProtocolTestBase *)this);
  if ((pTVar2->has_private_metadata != 0) ||
     (bVar1 = TrustTokenMetadataTest::private_metadata(&this->super_TrustTokenMetadataTest), !bVar1)
     ) {
    (this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.issuer_max_batchsize = 1;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_28);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
      }
      bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                        ((HasNewFatalFailureHelper *)local_28);
      if (bVar1) {
        local_38 = 2;
      }
      else {
        local_38 = 0;
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_28);
      if (local_38 == 0) {
        issue_resp = (uint8_t *)0x0;
        msg_len = 0;
        bVar1 = TrustTokenProtocolTestBase::use_message((TrustTokenProtocolTestBase *)this);
        if (bVar1) {
          ptVar3 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                             (&(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase
                               .client);
          pcVar4 = (char *)0x4;
          local_7c = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                               (ptVar3,&issue_resp,&resp_len,10,"MSG",4);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_78,&local_7c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
          if (!bVar1) {
            testing::Message::Message(&local_88);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__1.message_,(internal *)local_78,
                       (AssertionResult *)
                       "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                       ,"false","true",pcVar4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_90,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                       ,0x400,pcVar4);
            testing::internal::AssertHelper::operator=(&local_90,&local_88);
            testing::internal::AssertHelper::~AssertHelper(&local_90);
            std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
            testing::Message::~Message(&local_88);
          }
          local_38 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
        }
        else {
          ptVar3 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                             (&(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase
                               .client);
          local_c4 = TRUST_TOKEN_CLIENT_begin_issuance(ptVar3,&issue_resp,&resp_len,10);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_c0,&local_c4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
          if (!bVar1) {
            testing::Message::Message(&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&free_issue_msg,(internal *)local_c0,
                       (AssertionResult *)
                       "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)",
                       "false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                       ,0x403,pcVar4);
            testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_d8);
            std::__cxx11::string::~string((string *)&free_issue_msg);
            testing::Message::~Message(&local_d0);
          }
          local_38 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
        }
        if (local_38 != 0) {
          return;
        }
        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&tokens_issued,issue_resp);
        ctx = std::unique_ptr<trust_token_issuer_st,_bssl::internal::Deleter>::get
                        (&(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.
                          issuer);
        request = issue_resp;
        public_metadata =
             TrustTokenMetadataTest::public_metadata(&this->super_TrustTokenMetadataTest);
        bVar1 = TrustTokenMetadataTest::private_metadata(&this->super_TrustTokenMetadataTest);
        local_11c = TRUST_TOKEN_ISSUER_issue
                              (ctx,(uint8_t **)&msg_len,(size_t *)&gtest_ar_.message_,
                               (size_t *)&gtest_ar__2.message_,request,resp_len,public_metadata,
                               bVar1,1);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_118,&local_11c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        pcVar4 = (char *)resp_len;
        if (!bVar1) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&free_msg,(internal *)local_118,
                     (AssertionResult *)
                     "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, public_metadata(), private_metadata(), 1)"
                     ,"false","true",(char *)resp_len);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                     ,0x409,pcVar4);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&free_msg);
          testing::Message::~Message(&local_128);
          pcVar4 = (char *)resp_len;
        }
        local_38 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (local_38 == 0) {
          std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar.message_,
                     (pointer)msg_len);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_short,_nullptr>
                    ((EqHelper *)local_168,"tokens_issued","issuer_max_batchsize",
                     (unsigned_long *)&gtest_ar__2.message_,
                     &(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.
                      issuer_max_batchsize);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar1) {
            testing::Message::Message(&local_170);
            message = testing::AssertionResult::failure_message((AssertionResult *)local_168);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&key_index,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                       ,0x40b,message);
            testing::internal::AssertHelper::operator=((AssertHelper *)&key_index,&local_170);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_index);
            testing::Message::~Message(&local_170);
          }
          local_38 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (local_38 == 0) {
            ptVar3 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                               (&(this->super_TrustTokenMetadataTest).
                                 super_TrustTokenProtocolTestBase.client);
            __p = TRUST_TOKEN_CLIENT_finish_issuance
                            (ptVar3,(size_t *)&tokens,(uint8_t *)msg_len,
                             (size_t)gtest_ar_.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
            std::unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter> *)
                       &gtest_ar__3.message_,__p);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter>>
                      ((AssertionResult *)local_198,
                       (unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter> *)
                       &gtest_ar__3.message_,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
            if (!bVar1) {
              testing::Message::Message(&local_1a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1.message_,(internal *)local_198,
                         (AssertionResult *)"tokens","false","true",pcVar4);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                         ,0x410,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
              testing::internal::AssertHelper::~AssertHelper(&local_1a8);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_1a0);
            }
            local_38 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
            if (local_38 == 0) {
              sk = std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::get
                             ((unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter> *)
                              &gtest_ar__3.message_);
              local_1e0 = sk_TRUST_TOKEN_num(sk);
              local_1e8 = 1;
              testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                        ((EqHelper *)local_1d8,"sk_TRUST_TOKEN_num(tokens.get())","1UL",&local_1e0,
                         &local_1e8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
              if (!bVar1) {
                testing::Message::Message(&local_1f0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                           ,0x411,pcVar4);
                testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
                testing::internal::AssertHelper::~AssertHelper(&local_1f8);
                testing::Message::~Message(&local_1f0);
              }
              local_38 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
              if (local_38 == 0) {
                local_38 = 0;
              }
            }
            std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter> *)
                       &gtest_ar__3.message_);
          }
          std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar.message_);
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&tokens_issued);
        return;
      }
    }
    testing::Message::Message(&local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&issue_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x3fa,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&issue_msg,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&issue_msg);
    testing::Message::~Message(&local_40);
  }
  return;
}

Assistant:

TEST_P(TrustTokenMetadataTest, TooManyRequests) {
  if (!method()->has_private_metadata && private_metadata()) {
    return;
  }

  issuer_max_batchsize = 1;
  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);
  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      public_metadata(), private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);
  ASSERT_EQ(tokens_issued, issuer_max_batchsize);
  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, issue_resp,
                                         resp_len));
  ASSERT_TRUE(tokens);
  ASSERT_EQ(sk_TRUST_TOKEN_num(tokens.get()), 1UL);
}